

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>_>,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Hash,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
::destroy_slots(raw_hash_set<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>_>,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Hash,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
                *this)

{
  void *p;
  bool bVar1;
  allocator_type *paVar2;
  size_t n;
  ctrl_t *pcVar3;
  size_t *psVar4;
  undefined1 local_28 [8];
  Layout layout;
  size_t i;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>_>,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Hash,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
  *this_local;
  
  if (*(long *)(this + 0x18) != 0) {
    for (layout.super_LayoutType<sizeof___(Ts),_signed_char,_std::shared_ptr<vmips::VirtReg>_>.size_
         [1] = 0; layout.
                  super_LayoutType<sizeof___(Ts),_signed_char,_std::shared_ptr<vmips::VirtReg>_>.
                  size_[1] != *(size_t *)(this + 0x18);
        layout.super_LayoutType<sizeof___(Ts),_signed_char,_std::shared_ptr<vmips::VirtReg>_>.size_
        [1] = layout.super_LayoutType<sizeof___(Ts),_signed_char,_std::shared_ptr<vmips::VirtReg>_>.
              size_[1] + 1) {
      bVar1 = IsFull(*(ctrl_t *)
                      (*(long *)this +
                      layout.
                      super_LayoutType<sizeof___(Ts),_signed_char,_std::shared_ptr<vmips::VirtReg>_>
                      .size_[1]));
      if (bVar1) {
        paVar2 = alloc_ref(this);
        hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>>,void>::
        destroy<std::allocator<std::shared_ptr<vmips::VirtReg>>>
                  (paVar2,(slot_type *)
                          (*(long *)(this + 8) +
                          layout.
                          super_LayoutType<sizeof___(Ts),_signed_char,_std::shared_ptr<vmips::VirtReg>_>
                          .size_[1] * 0x10));
      }
    }
    _local_28 = (size_t  [2])MakeLayout(*(size_t *)(this + 0x18));
    SanitizerUnpoisonMemoryRegion(*(void **)(this + 8),*(long *)(this + 0x18) << 4);
    paVar2 = alloc_ref(this);
    p = *(void **)this;
    n = internal_layout::
        LayoutImpl<std::tuple<signed_char,_std::shared_ptr<vmips::VirtReg>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>_>
        ::AllocSize((LayoutImpl<std::tuple<signed_char,_std::shared_ptr<vmips::VirtReg>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>_>
                     *)local_28);
    Deallocate<8ul,std::allocator<std::shared_ptr<vmips::VirtReg>>>(paVar2,p,n);
    pcVar3 = EmptyGroup();
    *(ctrl_t **)this = pcVar3;
    *(undefined8 *)(this + 8) = 0;
    *(undefined8 *)(this + 0x10) = 0;
    *(undefined8 *)(this + 0x18) = 0;
    psVar4 = growth_left(this);
    *psVar4 = 0;
  }
  return;
}

Assistant:

void destroy_slots() {
        if (!capacity_) return;
        for (size_t i = 0; i != capacity_; ++i) {
            if (IsFull(ctrl_[i])) {
                PolicyTraits::destroy(&alloc_ref(), slots_ + i);
            }
        }
        auto layout = MakeLayout(capacity_);
        // Unpoison before returning the memory to the allocator.
        SanitizerUnpoisonMemoryRegion(slots_, sizeof(slot_type) * capacity_);
        Deallocate<Layout::Alignment()>(&alloc_ref(), ctrl_, layout.AllocSize());
        ctrl_ = EmptyGroup();
        slots_ = nullptr;
        size_ = 0;
        capacity_ = 0;
        growth_left() = 0;
    }